

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow
          (LayoutTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  void *pvVar4;
  FailedAssertion *pFVar5;
  long lVar6;
  factory_ptr f;
  layout l3;
  layout l2;
  layout l1;
  char_to_index indices [4];
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [16];
  richtext_t local_280;
  box_r local_218;
  undefined8 uStack_210;
  box_r local_208;
  undefined8 uStack_200;
  box_r local_1f8;
  undefined8 uStack_1f0;
  layout local_1e8;
  layout local_198;
  layout local_148;
  glyph local_f8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000042;
  local_f8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x300000043;
  local_f8.metrics.dx = 1.58101006669199e-322;
  local_f8.metrics.dy = 2.12199582307954e-314;
  local_f8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x401c666666666666;
  local_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0x4026000000000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0x402a000000000000;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0x4031000000000000;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_290,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])&local_f8);
  local_148._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._glyphs._limit = (positioned_glyph *)0x0;
  local_148._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._glyphs._begin = (positioned_glyph *)0x0;
  local_148._glyphs._end = (positioned_glyph *)0x0;
  local_148._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._glyphs._limit = (positioned_glyph *)0x0;
  local_198._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198._glyphs._begin = (positioned_glyph *)0x0;
  local_198._glyphs._end = (positioned_glyph *)0x0;
  local_1e8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8._glyphs._limit = (positioned_glyph *)0x0;
  local_1e8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._glyphs._begin = (positioned_glyph *)0x0;
  local_1e8._glyphs._end = (positioned_glyph *)0x0;
  paVar1 = &local_2d0.field_2;
  local_2d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"ABC CBA AB\nABB BBC\n","");
  R(&local_280,&local_2d0);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_148,&local_280,local_290._0_8_);
  paVar3 = &local_280._base_annotation.basic.family.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._base_annotation.basic.family._M_dataplus._M_p != paVar3) {
    operator_delete(local_280._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_280._annotations);
  paVar2 = &local_280._underlying.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._underlying._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"AC CB\nA AB\nABB BBC\n","");
  R(&local_280,&local_2d0);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_198,&local_280,local_290._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._base_annotation.basic.family._M_dataplus._M_p != paVar3) {
    operator_delete(local_280._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_280._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._underlying._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"AC CB\nA AB\nABB BBC","");
  R(&local_280,&local_2d0);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1e8,&local_280,local_290._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._base_annotation.basic.family._M_dataplus._M_p != paVar3) {
    operator_delete(local_280._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_280._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._underlying._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_1f8 = local_148._box;
  uStack_1f0 = 0;
  local_208 = local_198._box;
  uStack_200 = 0;
  local_218 = local_1e8._box;
  uStack_210 = 0;
  paVar3 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_280,&local_2b0,0xcf);
  if ((local_1f8.w == 120.2) && (!NAN(local_1f8.w))) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._underlying._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._underlying._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo((LocationInfo *)&local_280,&local_2b0,0xd0);
    if ((local_208.w == 87.1) && (!NAN(local_208.w))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._underlying._M_dataplus._M_p != paVar2) {
        operator_delete(local_280._underlying._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      local_2b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo((LocationInfo *)&local_280,&local_2b0,0xd1);
      if ((local_218.w == 87.1) && (!NAN(local_218.w))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._underlying._M_dataplus._M_p != paVar2) {
          operator_delete(local_280._underlying._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar3) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if (local_1e8._text_lines.
            super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8._text_lines.
                          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                  (&local_1e8._glyph_runs);
        if (local_1e8._glyphs._begin != (positioned_glyph *)0x0) {
          operator_delete__(local_1e8._glyphs._begin);
        }
        if (local_198._text_lines.
            super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198._text_lines.
                          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                  (&local_198._glyph_runs);
        if (local_198._glyphs._begin != (positioned_glyph *)0x0) {
          operator_delete__(local_198._glyphs._begin);
        }
        if (local_148._text_lines.
            super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148._text_lines.
                          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                  (&local_148._glyph_runs);
        if (local_148._glyphs._begin != (positioned_glyph *)0x0) {
          operator_delete__(local_148._glyphs._begin);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_);
        }
        lVar6 = 0x88;
        do {
          pvVar4 = *(void **)((long)&local_f8.outline.
                                     super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6);
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4);
          }
          lVar6 = lVar6 + -0x28;
        } while (lVar6 != -0x18);
        return;
      }
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_2d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d0,"Values are not equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,&local_2d0,(LocationInfo *)&local_280);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_2d0,(LocationInfo *)&local_280);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_2d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar5,&local_2d0,(LocationInfo *)&local_280);
  __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("ABC CBA AB\nABB BBC\n"), limit::none(), *f);
				l2.process(R("AC CB\nA AB\nABB BBC\n"), limit::none(), *f);
				l3.process(R("AC CB\nA AB\nABB BBC"), limit::none(), *f); // Last row will be checked even if no newline is encountered.

				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(120.2f, box1.w);
				assert_equal(87.1f, box2.w);
				assert_equal(87.1f, box3.w);
			}